

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMan.c
# Opt level: O2

void Gia_ManDfsSlacksPrint(Gia_Man_t *p)

{
  int *__s;
  int iVar1;
  uint uVar2;
  uint uVar3;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  ulong uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  
  p_00 = Gia_ManDfsSlacks(p);
  iVar5 = p_00->nSize;
  if (iVar5 == 0) {
    puts("Network contains no internal objects.");
  }
  else {
    iVar6 = 0;
    if (iVar5 < 1) {
      iVar5 = 0;
    }
    for (; iVar5 != iVar6; iVar6 = iVar6 + 1) {
      iVar1 = Vec_IntEntry(p_00,iVar6);
      if (iVar1 != -1) {
        Vec_IntWriteEntry(p_00,iVar6,iVar1 / 10);
      }
    }
    iVar6 = Vec_IntFindMax(p_00);
    uVar7 = iVar6 + 1;
    p_01 = Vec_IntAlloc(uVar7);
    p_01->nSize = uVar7;
    __s = p_01->pArray;
    if (__s != (int *)0x0) {
      memset(__s,0,(long)(int)uVar7 << 2);
    }
    for (iVar1 = 0; iVar5 != iVar1; iVar1 = iVar1 + 1) {
      uVar2 = Vec_IntEntry(p_00,iVar1);
      if (uVar2 != 0xffffffff) {
        if (((int)uVar2 < 0) || (iVar6 < (int)uVar2)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
        }
        __s[uVar2] = __s[uVar2] + 1;
      }
    }
    uVar4 = 0;
    uVar8 = (ulong)uVar7;
    if ((int)uVar7 < 1) {
      uVar8 = uVar4;
    }
    iVar5 = 0;
    for (; uVar8 != uVar4; uVar4 = uVar4 + 1) {
      iVar5 = iVar5 + __s[uVar4];
    }
    if (iVar5 < 1) {
      __assert_fail("nTotal > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaMan.c"
                    ,0x498,"void Gia_ManDfsSlacksPrint(Gia_Man_t *)");
    }
    uVar7 = 0;
    for (uVar2 = 0; (int)uVar2 <= iVar6; uVar2 = uVar2 + 1) {
      uVar3 = Vec_IntEntry(p_01,uVar2);
      printf("Slack range %3d = ",(ulong)uVar2);
      printf("[%4d, %4d)   ",(ulong)uVar7,(ulong)(uVar7 + 10));
      printf("Nodes = %5d  ",(ulong)uVar3);
      printf("(%6.2f %%) ",((double)(int)uVar3 * 100.0) / (double)iVar5);
      putchar(10);
      uVar7 = uVar7 + 10;
    }
    Vec_IntFree(p_00);
    p_00 = p_01;
  }
  Vec_IntFree(p_00);
  return;
}

Assistant:

void Gia_ManDfsSlacksPrint( Gia_Man_t * p )
{
    Vec_Int_t * vCounts, * vSlacks = Gia_ManDfsSlacks( p );
    int i, Entry, nRange, nTotal;
    if ( Vec_IntSize(vSlacks) == 0 )
    {
        printf( "Network contains no internal objects.\n" );
        Vec_IntFree( vSlacks );
        return;
    }
    // compute slacks
    Vec_IntForEachEntry( vSlacks, Entry, i )
        if ( Entry != -1 )
            Vec_IntWriteEntry( vSlacks, i, Entry/10 );
    nRange = Vec_IntFindMax( vSlacks );
    // count items
    vCounts = Vec_IntStart( nRange + 1 );
    Vec_IntForEachEntry( vSlacks, Entry, i )
        if ( Entry != -1 )
            Vec_IntAddToEntry( vCounts, Entry, 1 );
    // print slack ranges
    nTotal = Vec_IntSum( vCounts );
    assert( nTotal > 0 );
    Vec_IntForEachEntry( vCounts, Entry, i )
    {
        printf( "Slack range %3d = ", i );
        printf( "[%4d, %4d)   ", 10*i, 10*(i+1) );
        printf( "Nodes = %5d  ", Entry );
        printf( "(%6.2f %%) ", 100.0*Entry/nTotal );
        printf( "\n" );
    }
    Vec_IntFree( vSlacks );
    Vec_IntFree( vCounts );
}